

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

Offset<reflection::Object> __thiscall
flatbuffers::StructDef::Serialize(StructDef *this,FlatBufferBuilder *builder,Parser *parser)

{
  bool e;
  uint uVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  string *psVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t sVar5;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> OVar6;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> off;
  Offset<flatbuffers::String> off_00;
  Offset<reflection::Object> OVar7;
  pointer ppFVar8;
  Offset<reflection::Field> *v;
  pointer ppFVar9;
  vector<flatbuffers::Offset<reflection::Field>,_std::allocator<flatbuffers::Offset<reflection::Field>_>_>
  field_offsets;
  string decl_file_in_project;
  string qualified_name;
  Offset<reflection::Field> *local_a8;
  iterator iStack_a0;
  Offset<reflection::Field> *local_98;
  Offset<flatbuffers::String> local_8c;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>_> local_88;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> local_84;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  string local_60;
  ObjectBuilder local_40;
  
  local_a8 = (Offset<reflection::Field> *)0x0;
  iStack_a0._M_current = (Offset<reflection::Field> *)0x0;
  local_98 = (Offset<reflection::Field> *)0x0;
  ppFVar8 = (this->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar8 !=
      (this->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppFVar9 = ppFVar8;
    do {
      local_60._M_dataplus._M_p._0_4_ =
           FieldDef::Serialize(*ppFVar8,builder,
                               (uint16_t)
                               ((uint)((int)ppFVar9 -
                                      *(int *)&(this->fields).vec.
                                               super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3),
                               parser);
      if (iStack_a0._M_current == local_98) {
        std::
        vector<flatbuffers::Offset<reflection::Field>,std::allocator<flatbuffers::Offset<reflection::Field>>>
        ::_M_realloc_insert<flatbuffers::Offset<reflection::Field>>
                  ((vector<flatbuffers::Offset<reflection::Field>,std::allocator<flatbuffers::Offset<reflection::Field>>>
                    *)&local_a8,iStack_a0,(Offset<reflection::Field> *)&local_60);
      }
      else {
        (iStack_a0._M_current)->o = local_60._M_dataplus._M_p._0_4_;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
      ppFVar8 = ppFVar8 + 1;
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar8 !=
             (this->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  Namespace::GetFullyQualifiedName
            (&local_60,(this->super_Definition).defined_namespace,(string *)this,1000);
  FlatBufferBuilderImpl<false>::CreateStringImpl
            (builder,(char *)CONCAT44(local_60._M_dataplus._M_p._4_4_,
                                      local_60._M_dataplus._M_p._0_4_),local_60._M_string_length);
  uVar1 = (builder->buf_).size_;
  v = (Offset<reflection::Field> *)
      &data<flatbuffers::Offset<reflection::Field>,std::allocator<flatbuffers::Offset<reflection::Field>>>(std::vector<flatbuffers::Offset<reflection::Field>,std::allocator<flatbuffers::Offset<reflection::Field>>>&)
       ::t;
  if ((long)iStack_a0._M_current - (long)local_a8 != 0) {
    v = local_a8;
  }
  OVar6 = FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<reflection::Field>
                    (builder,v,(long)iStack_a0._M_current - (long)local_a8 >> 2);
  local_84 = SerializeAttributesCommon(&(this->super_Definition).attributes,builder,parser);
  off.o = 0;
  if ((parser->opts).binary_schema_comments == true) {
    begin._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    end._M_current =
         (this->super_Definition).doc_comment.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    off.o = 0;
    if (begin._M_current != end._M_current) {
      off = FlatBufferBuilderImpl<false>::
            CreateVectorOfStrings<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      (builder,begin,end);
    }
  }
  psVar2 = (this->super_Definition).declaration_file;
  local_80 = local_70;
  local_8c.o = uVar1;
  local_88 = OVar6;
  if (psVar2 == (string *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"");
  }
  else {
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar3,pcVar3 + psVar2->_M_string_length);
  }
  off_00 = FlatBufferBuilderImpl<false>::CreateSharedString(builder,(char *)local_80,local_78);
  e = this->fixed;
  sVar4 = this->minalign;
  sVar5 = this->bytesize;
  local_40.fbb_ = builder;
  FlatBufferBuilderImpl<false>::NotNested(builder);
  builder->nested = true;
  local_40.start_ = (builder->buf_).size_;
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(builder,0x12,off_00);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (builder,0x10,off);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>>
            (builder,0xe,local_84);
  FlatBufferBuilderImpl<false>::AddElement<int>(builder,0xc,(int)sVar5,0);
  FlatBufferBuilderImpl<false>::AddElement<int>(builder,10,(int)sVar4,0);
  FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>>
            (builder,6,local_88);
  FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(builder,4,local_8c);
  FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(builder,8,e,'\0');
  OVar7 = reflection::ObjectBuilder::Finish(&local_40);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_) !=
      &local_60.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_60._M_dataplus._M_p._4_4_,local_60._M_dataplus._M_p._0_4_),
                    local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != (Offset<reflection::Field> *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  return (Offset<reflection::Object>)OVar7.o;
}

Assistant:

Offset<reflection::Object> StructDef::Serialize(FlatBufferBuilder *builder,
                                                const Parser &parser) const {
  std::vector<Offset<reflection::Field>> field_offsets;
  for (auto it = fields.vec.begin(); it != fields.vec.end(); ++it) {
    field_offsets.push_back((*it)->Serialize(
        builder, static_cast<uint16_t>(it - fields.vec.begin()), parser));
  }
  const auto qualified_name = defined_namespace->GetFullyQualifiedName(name);
  const auto name__ = builder->CreateString(qualified_name);
  const auto flds__ = builder->CreateVectorOfSortedTables(&field_offsets);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  std::string decl_file_in_project = declaration_file ? *declaration_file : "";
  const auto file__ = builder->CreateSharedString(decl_file_in_project);
  return reflection::CreateObject(
      *builder, name__, flds__, fixed, static_cast<int>(minalign),
      static_cast<int>(bytesize), attr__, docs__, file__);
}